

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservableDictionaryExample.cpp
# Opt level: O2

void __thiscall DictListener::OnItemRemoved(DictListener *this,int *k,string *v)

{
  LoggerWriter *pLVar1;
  undefined1 *puVar2;
  undefined1 auStack_1a8 [408];
  
  Logger::LoggerWriter::LoggerWriter((LoggerWriter *)auStack_1a8,Info);
  std::operator<<((ostream *)(auStack_1a8 + 0x18),"DictListener::OnItemRemoved(");
  pLVar1 = Logger::LoggerWriter::operator<<((LoggerWriter *)auStack_1a8,k);
  puVar2 = &pLVar1->field_0x18;
  std::operator<<((ostream *)puVar2,", ");
  std::operator<<((ostream *)puVar2,(string *)v);
  std::operator<<((ostream *)puVar2,")");
  Logger::LoggerWriter::~LoggerWriter((LoggerWriter *)auStack_1a8);
  return;
}

Assistant:

virtual void OnItemRemoved(const int& k, const std::string& v)
    {
        Logger::Log(LogLevel::Info) << "DictListener::OnItemRemoved(" << k << ", " << v << ")";
    }